

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O2

int __thiscall MSH::mesh_file::scan_Elements(mesh_file *this,fstream *mesh_file,string *line_buffer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_str_vec;
  element input_ele;
  is_any_ofF<char> local_88;
  pair<const_int,_MSH::element> local_70;
  
  while( true ) {
    bVar1 = std::operator!=(line_buffer,"$EndElements");
    if (!bVar1) {
      return 0;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)mesh_file,(string *)line_buffer);
    boost::algorithm::erase_all<std::__cxx11::string,char[2]>(line_buffer,(char (*) [2])0x15bf06);
    bVar1 = std::operator==(line_buffer,"$EndElements");
    if (bVar1) break;
    iVar2 = check_read_state(mesh_file);
    if (iVar2 != 0) {
      return 1;
    }
    split_str_vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    split_str_vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    split_str_vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    boost::algorithm::is_any_of<char[2]>(&local_88,(char (*) [2])0x15e7f6);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&split_str_vec,line_buffer,&local_88,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_88);
    uVar6 = (long)split_str_vec.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)split_str_vec.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (5 < uVar6) {
      input_ele.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      input_ele.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      input_ele.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      input_ele.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      input_ele.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      input_ele.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      iVar2 = std::__cxx11::stoi(split_str_vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
      input_ele.type =
           std::__cxx11::stoi(split_str_vec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
      iVar3 = std::__cxx11::stoi(split_str_vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
      lVar4 = 0x60;
      for (uVar5 = 3; (int)uVar5 < iVar3 + 3; uVar5 = uVar5 + 1) {
        local_70.first =
             std::__cxx11::stoi((string *)
                                ((long)&((split_str_vec.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar4),(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&input_ele.tags,&local_70.first);
        lVar4 = lVar4 + 0x20;
      }
      for (; uVar5 < uVar6; uVar5 = uVar5 + 1) {
        local_70.first =
             std::__cxx11::stoi((string *)
                                ((long)&((split_str_vec.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar4),(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&input_ele.node_vect,&local_70.first);
        lVar4 = lVar4 + 0x20;
      }
      local_70.first = iVar2;
      element::element(&local_70.second,&input_ele);
      std::
      _Rb_tree<int,std::pair<int_const,MSH::element>,std::_Select1st<std::pair<int_const,MSH::element>>,std::less<int>,std::allocator<std::pair<int_const,MSH::element>>>
      ::_M_insert_unique<std::pair<int_const,MSH::element>>
                ((_Rb_tree<int,std::pair<int_const,MSH::element>,std::_Select1st<std::pair<int_const,MSH::element>>,std::less<int>,std::allocator<std::pair<int_const,MSH::element>>>
                  *)&this->elements_map,&local_70);
      element::~element(&local_70.second);
      element::~element(&input_ele);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&split_str_vec);
  }
  return 0;
}

Assistant:

int MSH::mesh_file::scan_Elements(std::fstream &mesh_file, std::string &line_buffer)
{
    while (line_buffer!="$EndElements")
    {
        getline(mesh_file,line_buffer);
        boost::erase_all(line_buffer, "\r");
        if (line_buffer=="$EndElements")
            break;
        if (check_read_state(mesh_file))
            return EXIT_FAILURE;
        std::vector<std::string> split_str_vec;
        boost::split(split_str_vec, line_buffer, boost::is_any_of(" "));
        auto element_size = split_str_vec.size();
        if (element_size>5)
        {
            element input_ele;
            int counter = 0;
            int index = std::stoi(split_str_vec[counter++]);
            input_ele.type = std::stoi(split_str_vec[counter++]);
            int tag_count = std::stoi(split_str_vec[counter++]);
            auto first_end = counter+tag_count;
            for (auto i = counter; i < first_end; i++)
            {
                input_ele.tags.push_back(std::stoi(split_str_vec[counter]));
                counter++;
            }
            for (auto j = counter; j < element_size; j++)
            {
                input_ele.node_vect.push_back(std::stoi(split_str_vec[j]));
            }
            elements_map.insert({index, input_ele});
        }
    }
    return EXIT_SUCCESS;
}